

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CivetServer.cpp
# Opt level: O0

int CivetServer::webSocketConnectionHandler(mg_connection *conn,void *cbdata)

{
  byte bVar1;
  mg_request_info *pmVar2;
  CivetWebSocketHandler *handler;
  CivetServer *me;
  mg_request_info *request_info;
  void *cbdata_local;
  mg_connection *conn_local;
  
  pmVar2 = mg_get_request_info(conn);
  if (*(long *)((long)pmVar2->user_data + 8) == 0) {
    conn_local._4_4_ = 0;
  }
  else if (cbdata == (void *)0x0) {
    conn_local._4_4_ = 1;
  }
  else {
    bVar1 = (**(code **)(*cbdata + 0x10))(cbdata,pmVar2->user_data,conn);
    conn_local._4_4_ = (uint)((bVar1 & 1) == 0);
  }
  return conn_local._4_4_;
}

Assistant:

int
CivetServer::webSocketConnectionHandler(const struct mg_connection *conn,
                                        void *cbdata)
{
	const struct mg_request_info *request_info = mg_get_request_info(conn);
	assert(request_info != NULL);
	CivetServer *me = (CivetServer *)(request_info->user_data);
	assert(me != NULL);

	// Happens when a request hits the server before the context is saved
	if (me->context == NULL)
		return 0;

	CivetWebSocketHandler *handler = (CivetWebSocketHandler *)cbdata;

	if (handler) {
		return handler->handleConnection(me, conn) ? 0 : 1;
	}

	return 1; // No handler found, close connection
}